

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::StringLenMethod::StringLenMethod(StringLenMethod *this,Builtins *builtins)

{
  _Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_28;
  
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SimpleSystemSubroutine::SimpleSystemSubroutine
            (&this->super_SimpleSystemSubroutine,Len,Function,0,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_28,(Type *)&builtins->intType,true,false);
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_28);
  (this->super_SimpleSystemSubroutine).super_SystemSubroutine._vptr_SystemSubroutine =
       (_func_int **)&PTR__SimpleSystemSubroutine_005a7478;
  return;
}

Assistant:

explicit StringLenMethod(const Builtins& builtins) :
        SimpleSystemSubroutine(KnownSystemName::Len, SubroutineKind::Function, 0, {},
                               builtins.intType, true) {}